

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O0

void ccall_classify_ct(CTState *cts,CType *ct,int *rcl,CTSize ofs)

{
  int iVar1;
  uint uVar2;
  uint in_ECX;
  CType *in_RDX;
  CTState *in_RSI;
  long *in_RDI;
  int cl;
  CTSize asz;
  CTSize esz;
  CTSize eofs;
  CType *cct;
  uint local_78;
  uint local_6c;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  CTState *local_40;
  
  local_40 = in_RSI;
  if (*(uint *)&in_RSI->tab >> 0x1c == 3) {
    do {
      local_40 = (CTState *)(*in_RDI + (ulong)(*(uint *)&local_40->tab & 0xffff) * 0x10);
    } while (*(uint *)&local_40->tab >> 0x1c == 8);
    iVar1 = *(int *)((long)&local_40->tab + 4);
    uVar2 = *(uint *)((long)&in_RSI->tab + 4);
    for (local_6c = 0; local_6c < uVar2; local_6c = iVar1 + local_6c) {
      ccall_classify_ct(in_RSI,in_RDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),
                        (CTSize)((ulong)local_40 >> 0x20));
    }
  }
  else if (*(uint *)&in_RSI->tab >> 0x1c == 1) {
    ccall_classify_struct
              (in_RSI,in_RDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),
               (CTSize)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  else {
    local_78 = 1;
    if (((ulong)in_RSI->tab & 0xf4000000) == 0x4000000) {
      local_78 = 2;
    }
    if ((in_ECX & *(int *)((long)&in_RSI->tab + 4) - 1U) != 0) {
      local_78 = 4;
    }
    (&in_RDX->info)[(int)(uint)(7 < in_ECX)] = local_78 | (&in_RDX->info)[(int)(uint)(7 < in_ECX)];
  }
  return;
}

Assistant:

static void ccall_classify_ct(CTState *cts, CType *ct, int *rcl, CTSize ofs)
{
  if (ctype_isarray(ct->info)) {
    CType *cct = ctype_rawchild(cts, ct);
    CTSize eofs, esz = cct->size, asz = ct->size;
    for (eofs = 0; eofs < asz; eofs += esz)
      ccall_classify_ct(cts, cct, rcl, ofs+eofs);
  } else if (ctype_isstruct(ct->info)) {
    ccall_classify_struct(cts, ct, rcl, ofs);
  } else {
    int cl = ctype_isfp(ct->info) ? CCALL_RCL_SSE : CCALL_RCL_INT;
    lua_assert(ctype_hassize(ct->info));
    if ((ofs & (ct->size-1))) cl = CCALL_RCL_MEM;  /* Unaligned. */
    rcl[(ofs >= 8)] |= cl;
  }
}